

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O3

void __thiscall RouterLsaContent::RouterLsaContent(RouterLsaContent *this,istream *is)

{
  uint64_t uVar1;
  uint8_t uVar2;
  uint16_t *puVar3;
  initializer_list<unsigned_short> __l;
  uint8_t arr [4];
  uint16_t temp_tos [2];
  allocator_type local_5d;
  uint8_t local_5c [4];
  unsigned_short local_58;
  ushort local_56;
  unsigned_short local_54;
  ushort local_52;
  vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
  *local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  this->_vptr_RouterLsaContent = (_func_int **)&PTR__RouterLsaContent_00120620;
  local_50 = (vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              *)&this->toses;
  (this->toses).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->toses).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->toses).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::read((char *)is,(long)local_5c);
  uVar1 = arr2num(local_5c,'\x04');
  this->link_id = (uint32_t)uVar1;
  std::istream::read((char *)is,(long)local_5c);
  uVar1 = arr2num(local_5c,'\x04');
  this->link_data = (uint32_t)uVar1;
  std::istream::read((char *)is,(long)&this->link_type);
  std::istream::read((char *)is,(long)&this->tos_num);
  puVar3 = &this->tos0_metric;
  std::istream::read((char *)is,(long)puVar3);
  *puVar3 = *puVar3 << 8 | *puVar3 >> 8;
  uVar2 = this->tos_num;
  if (uVar2 != '\0') {
    do {
      std::istream::read((char *)is,(long)&local_54);
      local_58 = local_54;
      local_56 = local_52 << 8 | local_52 >> 8;
      __l._M_len = 2;
      __l._M_array = &local_58;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_48,__l,&local_5d);
      std::
      vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
      ::emplace_back<std::vector<unsigned_short,std::allocator<unsigned_short>>>(local_50,&local_48)
      ;
      if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar2 = uVar2 + 0xff;
    } while (uVar2 != '\0');
  }
  return;
}

Assistant:

RouterLsaContent::RouterLsaContent(std::istream& is)
{
    uint8_t arr[4];
    is.read((char*)&arr, 4);
    link_id = arr2num(arr, 4);
    is.read((char*)&arr, 4);
    link_data = arr2num(arr, 4);
    is.read((char*)&link_type, 1);
    is.read((char*)&tos_num, 1);
    is.read((char*)&tos0_metric, 2);
    tos0_metric = ntohs(tos0_metric);
    uint8_t num = tos_num;
    while (num != 0)
    {
        // 8bit: tos; 8bit: reserve; 16bit tos_metric. 可以没有。
        //数组的第一元素的值等于tos的值，因为保留字节通常为0，再加上网络字节顺序。
        //数组的第二元素的值还需要字节顺序转换。
        uint16_t temp_tos[2];
        is.read((char*)&temp_tos, 4);
        toses.push_back({temp_tos[0], ntohs(temp_tos[1])});
        --num;
    }
}